

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int cvNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector delta,realtype tol,N_Vector ewt,
                 void *cvode_mem)

{
  int iVar1;
  long in_R8;
  double in_XMM0_Qa;
  realtype rVar2;
  realtype dcon;
  realtype del;
  int retval;
  int m;
  CVodeMem cv_mem;
  N_Vector in_stack_ffffffffffffff88;
  N_Vector in_stack_ffffffffffffff90;
  N_Vector x;
  double local_60;
  int local_44;
  int local_4;
  
  if (in_R8 == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","cvNlsConvTest","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    rVar2 = N_VWrmsNorm(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iVar1 = SUNNonlinSolGetCurIter((SUNNonlinearSolver)in_stack_ffffffffffffff88,(int *)0xefebdb);
    if (iVar1 == 0) {
      if (0 < local_44) {
        if (*(double *)(in_R8 + 0x2a0) * 0.3 <= rVar2 / *(double *)(in_R8 + 0x2a8)) {
          local_60 = rVar2 / *(double *)(in_R8 + 0x2a8);
        }
        else {
          local_60 = *(double *)(in_R8 + 0x2a0) * 0.3;
        }
        *(double *)(in_R8 + 0x2a0) = local_60;
      }
      if (*(double *)(in_R8 + 0x2a0) <= 1.0) {
        x = *(N_Vector *)(in_R8 + 0x2a0);
      }
      else {
        x = (N_Vector)&DAT_3ff0000000000000;
      }
      if (1.0 < (rVar2 * (double)x) / in_XMM0_Qa) {
        if ((local_44 < 1) || (rVar2 <= *(double *)(in_R8 + 0x2a8) * 2.0)) {
          *(realtype *)(in_R8 + 0x2a8) = rVar2;
          local_4 = 0x385;
        }
        else {
          local_4 = 0x386;
        }
      }
      else {
        if (local_44 != 0) {
          rVar2 = N_VWrmsNorm(x,in_stack_ffffffffffffff88);
        }
        *(realtype *)(in_R8 + 0x2b0) = rVar2;
        *(undefined4 *)(in_R8 + 0x2b8) = 1;
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x15;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsConvTest(SUNNonlinearSolver NLS, N_Vector ycor, N_Vector delta,
                         realtype tol, N_Vector ewt, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  realtype del;
  realtype dcon;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "cvNlsConvTest", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* compute the norm of the correction */
  del = N_VWrmsNorm(delta, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) return(CV_MEM_NULL);

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.        */
  if (m > 0) {
    cv_mem->cv_crate = SUNMAX(CRDOWN * cv_mem->cv_crate, del/cv_mem->cv_delp);
  }
  dcon = del * SUNMIN(ONE, cv_mem->cv_crate) / tol;

  if (dcon <= ONE) {
    cv_mem->cv_acnrm = (m==0) ? del : N_VWrmsNorm(ycor, ewt);
    cv_mem->cv_acnrmcur = SUNTRUE;
    return(CV_SUCCESS); /* Nonlinear system was solved successfully */
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (del > RDIV*cv_mem->cv_delp)) return(SUN_NLS_CONV_RECVR);

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = del;

  /* Not yet converged */
  return(SUN_NLS_CONTINUE);
}